

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_snap.c
# Opt level: O0

BloomFilter snap_renamefilter(GCtrace *T,SnapNo lim)

{
  IRIns *ir;
  BloomFilter rfilt;
  SnapNo lim_local;
  GCtrace *T_local;
  
  rfilt = 0;
  for (ir = T->ir + (T->nins - 1); (ir->field_1).o == '\x14'; ir = ir + -1) {
    if ((ir->field_0).op2 <= lim) {
      rfilt = 1L << ((byte)(ir->field_0).op1 & 0x3f) | rfilt;
    }
  }
  return rfilt;
}

Assistant:

static BloomFilter snap_renamefilter(GCtrace *T, SnapNo lim)
{
  BloomFilter rfilt = 0;
  IRIns *ir;
  for (ir = &T->ir[T->nins-1]; ir->o == IR_RENAME; ir--)
    if (ir->op2 <= lim)
      bloomset(rfilt, ir->op1);
  return rfilt;
}